

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::InitTileOffsets
              (OffsetData *offset_data,EXRHeader *exr_header,
              vector<int,_std::allocator<int>_> *num_x_tiles,
              vector<int,_std::allocator<int>_> *num_y_tiles)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int lx;
  long lVar5;
  int iVar6;
  pointer pvVar7;
  uint uVar8;
  long lVar9;
  size_t dy;
  ulong uVar10;
  
  iVar6 = (int)((ulong)((long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  offset_data->num_x_levels = iVar6;
  iVar3 = (int)((ulong)((long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  offset_data->num_y_levels = iVar3;
  if ((uint)exr_header->tile_level_mode < 2) {
    if (iVar6 != iVar3) {
      __assert_fail("offset_data.num_x_levels == offset_data.num_y_levels",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                    ,0x159d,
                    "int tinyexr::InitTileOffsets(OffsetData &, const EXRHeader *, const std::vector<int> &, const std::vector<int> &)"
                   );
    }
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::resize(&offset_data->offsets,(long)iVar6);
    pvVar7 = (offset_data->offsets).
             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = 0;
    for (uVar8 = 0; uVar10 = (ulong)uVar8,
        uVar10 < (ulong)(((long)(offset_data->offsets).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18);
        uVar8 = uVar8 + 1) {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(pvVar7 + uVar10,
               (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
      uVar2 = 0;
      while( true ) {
        pvVar7 = (offset_data->offsets).
                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = *(long *)&pvVar7[uVar10].
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pvVar7[uVar10].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl + 8) - lVar4) / 0x18) <= (ulong)uVar2) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   (lVar4 + (ulong)uVar2 * 0x18),
                   (long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar10]);
        iVar6 = iVar6 + (num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10];
        uVar2 = uVar2 + 1;
      }
    }
  }
  else {
    if (exr_header->tile_level_mode != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                    ,0x15bc,
                    "int tinyexr::InitTileOffsets(OffsetData &, const EXRHeader *, const std::vector<int> &, const std::vector<int> &)"
                   );
    }
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::resize(&offset_data->offsets,(long)iVar3 * (long)iVar6);
    iVar6 = 0;
    for (lVar4 = 0; lVar4 < offset_data->num_y_levels; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 < offset_data->num_x_levels; lVar5 = lVar5 + 1) {
        iVar3 = offset_data->num_x_levels * (int)lVar4 + (int)lVar5;
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::resize((offset_data->offsets).
                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar3,
                 (long)(num_y_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar4]);
        lVar9 = 0;
        uVar10 = 0;
        while( true ) {
          pvVar7 = (offset_data->offsets).
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar1 = *(long *)&pvVar7[iVar3].
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl;
          if ((ulong)(((long)*(pointer *)
                              ((long)&pvVar7[iVar3].
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl + 8) - lVar1) / 0x18) <= uVar10) break;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar1 + lVar9),
                     (long)(num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar5]);
          iVar6 = iVar6 + (num_x_tiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar5];
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x18;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int InitTileOffsets(OffsetData& offset_data,
  const EXRHeader* exr_header,
  const std::vector<int>& num_x_tiles,
  const std::vector<int>& num_y_tiles) {
  int num_tile_blocks = 0;
  offset_data.num_x_levels = static_cast<int>(num_x_tiles.size());
  offset_data.num_y_levels = static_cast<int>(num_y_tiles.size());
  switch (exr_header->tile_level_mode) {
  case TINYEXR_TILE_ONE_LEVEL:
  case TINYEXR_TILE_MIPMAP_LEVELS:
    assert(offset_data.num_x_levels == offset_data.num_y_levels);
    offset_data.offsets.resize(size_t(offset_data.num_x_levels));

    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
      offset_data.offsets[l].resize(size_t(num_y_tiles[l]));

      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
        offset_data.offsets[l][dy].resize(size_t(num_x_tiles[l]));
        num_tile_blocks += num_x_tiles[l];
      }
    }
    break;

  case TINYEXR_TILE_RIPMAP_LEVELS:

    offset_data.offsets.resize(static_cast<size_t>(offset_data.num_x_levels) * static_cast<size_t>(offset_data.num_y_levels));

    for (int ly = 0; ly < offset_data.num_y_levels; ++ly) {
      for (int lx = 0; lx < offset_data.num_x_levels; ++lx) {
        int l = ly * offset_data.num_x_levels + lx;
        offset_data.offsets[size_t(l)].resize(size_t(num_y_tiles[size_t(ly)]));

        for (size_t dy = 0; dy < offset_data.offsets[size_t(l)].size(); ++dy) {
          offset_data.offsets[size_t(l)][dy].resize(size_t(num_x_tiles[size_t(lx)]));
          num_tile_blocks += num_x_tiles[size_t(lx)];
        }
      }
    }
    break;

  default:
    assert(false);
  }
  return num_tile_blocks;
}